

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_jit.c
# Opt level: O1

int ravi_is_compiled(lua_State *L)

{
  int iVar1;
  void *pvVar2;
  
  iVar1 = lua_gettop(L);
  if (iVar1 != 1) {
    luaL_argerror(L,1,"1 argument expected");
  }
  iVar1 = lua_type(L,1);
  if (iVar1 == 6) {
    iVar1 = lua_iscfunction(L,1);
    if (iVar1 == 0) goto LAB_00134c04;
  }
  luaL_argerror(L,1,"argument must be a Lua function");
LAB_00134c04:
  pvVar2 = lua_topointer(L,1);
  lua_pushboolean(L,(uint)(*(char *)(*(long *)((long)pvVar2 + 0x18) + 0x78) == '\x02'));
  return 1;
}

Assistant:

static int ravi_is_compiled(lua_State *L) {
  int n = lua_gettop(L);
  luaL_argcheck(L, n == 1, 1, "1 argument expected");
  luaL_argcheck(L, lua_isfunction(L, 1) && !lua_iscfunction(L, 1), 1,
                "argument must be a Lua function");
  void *p = (void *)lua_topointer(L, 1);
  LClosure *l = (LClosure *)(p);
  lua_pushboolean(L, l->p->ravi_jit.jit_status == RAVI_JIT_COMPILED);
  return 1;
}